

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O2

object_task<lzham::search_accelerator> * __thiscall
lzham::
lzham_new<lzham::object_task<lzham::search_accelerator>,lzham::search_accelerator*,void(lzham::search_accelerator::*)(unsigned_long_long,void*),lzham::object_task_flags>
          (lzham *this,search_accelerator **init0,offset_in_search_accelerator_to_subr *init1,
          object_task_flags *init2)

{
  search_accelerator *psVar1;
  search_accelerator *psVar2;
  search_accelerator *psVar3;
  offset_in_search_accelerator_to_subr oVar4;
  object_task<lzham::search_accelerator> *poVar5;
  
  poVar5 = (object_task<lzham::search_accelerator> *)lzham_malloc(0x28,(size_t *)0x0);
  if (poVar5 != (object_task<lzham::search_accelerator> *)0x0) {
    psVar1 = *(search_accelerator **)this;
    oVar4 = *init1;
    (poVar5->super_executable_task)._vptr_executable_task = (_func_int **)&PTR_execute_task_00124d68
    ;
    psVar2 = *init0;
    psVar3 = init0[1];
    poVar5->m_pObject = psVar1;
    poVar5->m_pMethod = (object_method_ptr)psVar2;
    *(search_accelerator **)&poVar5->field_0x18 = psVar3;
    poVar5->m_flags = (uint)oVar4;
  }
  return poVar5;
}

Assistant:

inline T* lzham_new(const A& init0, const B& init1, const C& init2)
   {
      T* p = static_cast<T*>(lzham_malloc(sizeof(T)));
      if (!p) return NULL;
      return new (static_cast<void*>(p)) T(init0, init1, init2); 
   }